

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_range.c
# Opt level: O1

int utf8_range_IsValid(char *data,size_t len)

{
  long lVar1;
  size_t sVar2;
  ulong *end;
  ulong *data_00;
  
  if (len == 0) {
    return 1;
  }
  end = (ulong *)(data + len);
  if (7 < (long)len) {
    do {
      if ((*(ulong *)data & 0x8080808080808080) != 0) break;
      data = (char *)((long)data + 8);
      len = len - 8;
    } while (7 < (long)len);
  }
  data_00 = (ulong *)data;
  if (data < end) {
    lVar1 = (long)end - (long)data;
    do {
      data_00 = (ulong *)data;
      if ((char)*(ulong *)data < '\0') break;
      data = (char *)((long)data + 1);
      lVar1 = lVar1 + -1;
      data_00 = end;
    } while (lVar1 != 0);
  }
  sVar2 = utf8_range_ValidateUTF8Naive((char *)data_00,(char *)end,0);
  return (int)(sVar2 != 0);
}

Assistant:

static FORCE_INLINE_ATTR inline size_t utf8_range_Validate(
    const char* data, size_t len, int return_position) {
  if (len == 0) return 1 - return_position;
  // Save buffer start address for later use
  const char* const data_original = data;
  const char* const end = data + len;
  data = utf8_range_SkipAscii(data, end);
  /* SIMD algorithm always outperforms the naive version for any data of
     length >=16.
   */
  if (end - data < 16) {
    return (return_position ? (data - data_original) : 0) +
           utf8_range_ValidateUTF8Naive(data, end, return_position);
  }
#if defined(__SSE4_1__) || (defined(__ARM_NEON) && defined(__ARM_64BIT_STATE))
  return utf8_range_ValidateUTF8Simd(
      data_original, data, end, return_position);
#else
  return (return_position ? (data - data_original) : 0) +
         utf8_range_ValidateUTF8Naive(data, end, return_position);
#endif
}